

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChronoFPSLimiterTests.cpp
# Opt level: O2

void __thiscall
solitaire::ConstructedChronoFPSLimiterTests_sleepRestOfFrameTimeSavedUsingSaveMethod_Test::TestBody
          (ConstructedChronoFPSLimiterTests_sleepRestOfFrameTimeSavedUsingSaveMethod_Test *this)

{
  ChronoFPSLimiterTests::expectGetActualTime((ChronoFPSLimiterTests *)this,4);
  (*(((this->super_ConstructedChronoFPSLimiterTests).fpsLimiter._M_t.
      super___uniq_ptr_impl<solitaire::time::ChronoFPSLimiter,_std::default_delete<solitaire::time::ChronoFPSLimiter>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::time::ChronoFPSLimiter_*,_std::default_delete<solitaire::time::ChronoFPSLimiter>_>
      .super__Head_base<0UL,_solitaire::time::ChronoFPSLimiter_*,_false>._M_head_impl)->
    super_FPSLimiter)._vptr_FPSLimiter[2])();
  ChronoFPSLimiterTests::expectGetActualTime((ChronoFPSLimiterTests *)this,5);
  ChronoFPSLimiterTests::expectSleepForCalculatedRestOfTime((ChronoFPSLimiterTests *)this,4,5);
  (*(((this->super_ConstructedChronoFPSLimiterTests).fpsLimiter._M_t.
      super___uniq_ptr_impl<solitaire::time::ChronoFPSLimiter,_std::default_delete<solitaire::time::ChronoFPSLimiter>_>
      ._M_t.
      super__Tuple_impl<0UL,_solitaire::time::ChronoFPSLimiter_*,_std::default_delete<solitaire::time::ChronoFPSLimiter>_>
      .super__Head_base<0UL,_solitaire::time::ChronoFPSLimiter_*,_false>._M_head_impl)->
    super_FPSLimiter)._vptr_FPSLimiter[3])();
  return;
}

Assistant:

TEST_F(ConstructedChronoFPSLimiterTests, sleepRestOfFrameTimeSavedUsingSaveMethod) {
    constexpr Milliseconds start {4}, stop {5};

    expectGetActualTime(start);
    fpsLimiter->saveFrameStartTime();

    expectGetActualTime(stop);
    expectSleepForCalculatedRestOfTime(start, stop);
    fpsLimiter->sleepRestOfFrameTime();
}